

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::estimate_clock_resolution<std::chrono::_V2::system_clock>
          (environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,int iterations)

{
  double dVar1;
  pointer first;
  pointer last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  _func_vector<double,_std::allocator<double>_>_int **in_R9;
  vector<double,_std::allocator<double>_> r;
  _Vector_base<double,_std::allocator<double>_> local_b0;
  outlier_classification local_98;
  code *local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*(run_for_at_least_argument_t<system_clock,_vector<double,_allocator<double>_>_(*)(int)>))(int)>
  local_40;
  
  last_00._M_current._4_4_ = 0;
  last_00._M_current._0_4_ = iterations;
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._4_4_ = 0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  local_80 = resolution<std::chrono::_V2::system_clock>;
  run_for_at_least<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*)(int)>
            (&local_40,(detail *)&local_78,(parameters *)0x1dcd6500,
             (Duration<std::chrono::_V2::system_clock>)last_00._M_current,(int)&local_80,in_R9);
  last = local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  first = local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_b0._M_impl.super__Vector_impl_data._M_start =
       local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0._M_impl.super__Vector_impl_data._M_finish =
       local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b0._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_40.result.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_78);
  dVar1 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )last);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_98,(detail *)first,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)last,
             last_00);
  (__return_storage_ptr__->outliers).high_severe = local_98.high_severe;
  (__return_storage_ptr__->outliers).samples_seen = local_98.samples_seen;
  (__return_storage_ptr__->outliers).low_severe = local_98.low_severe;
  (__return_storage_ptr__->outliers).low_mild = local_98.low_mild;
  (__return_storage_ptr__->outliers).high_mild = local_98.high_mild;
  (__return_storage_ptr__->mean).__r = dVar1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

environment_estimate<FloatDuration<Clock>> estimate_clock_resolution(int iterations) {
            auto r = run_for_at_least<Clock>({}, chrono::duration_cast<Duration<Clock>>(clock_resolution_estimation_time), iterations, &resolution<Clock>)
                    .result;
            return {
                FloatDuration<Clock>(mean(r.begin(), r.end())),
                classify_outliers(r.begin(), r.end()),
            };
        }